

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmt_bin_decode.c
# Opt level: O0

void mmt_decode(mmt_decode_funcs *funcs,void *state)

{
  mmt_ioctl_post_v2 *pmVar1;
  mmt_ioctl_pre_v2 *pmVar2;
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  void *pvVar6;
  mmt_read *pmVar7;
  mmt_read2 *pmVar8;
  mmt_write *pmVar9;
  mmt_write2 *pmVar10;
  mmt_mmap2 *pmVar11;
  mmt_mmap *pmVar12;
  mmt_unmap *pmVar13;
  mmt_mremap *pmVar14;
  mmt_open *pmVar15;
  mmt_write_syscall *pmVar16;
  mmt_sync *pmVar17;
  mmt_dup_syscall *pmVar18;
  mmt_ioctl_pre_v2 *pmVar19;
  mmt_ioctl_post_v2 *pmVar20;
  mmt_buf *local_4a8;
  mmt_buf *b_1;
  mmt_memory_dump_v2_prefix *d_1;
  mmt_ioctl_post_v2 *pmStack_490;
  int argc_1;
  mmt_ioctl_post_v2 *ctl_1;
  mmt_memory_dump args_1 [20];
  uint local_2a0;
  uint pfx_1;
  uint size2_1;
  mmt_buf *b;
  mmt_memory_dump_v2_prefix *d;
  mmt_ioctl_pre_v2 *pmStack_280;
  int argc;
  mmt_ioctl_pre_v2 *ctl;
  mmt_memory_dump args [20];
  uint pfx;
  uint size2;
  mmt_dup_syscall *mm_5;
  mmt_sync *mm_4;
  mmt_write_syscall *w_4;
  mmt_open *o;
  mmt_mremap *mm_3;
  mmt_unmap *mm_2;
  mmt_mmap *mm_1;
  mmt_mmap2 *mm;
  mmt_write2 *w_3;
  mmt_write *w_2;
  mmt_read2 *w_1;
  mmt_read *w;
  uint len;
  mmt_message *msg;
  uint size;
  void *state_local;
  mmt_decode_funcs *funcs_local;
  
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  while( true ) {
                    while( true ) {
                      while( true ) {
                        while( true ) {
                          while( true ) {
                            while( true ) {
                              while( true ) {
                                while( true ) {
                                  pbVar5 = (byte *)mmt_load_initial_data();
                                  if (pbVar5 == (byte *)0x0) {
                                    return;
                                  }
                                  if ((*pbVar5 != 0x3d) && (*pbVar5 != 0x2d)) break;
                                  w._4_4_ = 0;
                                  while (mmt_buf[mmt_idx + w._4_4_] != '\n') {
                                    w._4_4_ = w._4_4_ + 1;
                                    pvVar6 = mmt_load_data(w._4_4_);
                                    if (pvVar6 == (void *)0x0) {
                                      return;
                                    }
                                  }
                                  if (funcs->msg != (_func_void_uint8_t_ptr_uint_void_ptr *)0x0) {
                                    (*funcs->msg)(mmt_buf + mmt_idx,w._4_4_,state);
                                  }
                                  mmt_idx = w._4_4_ + 1 + mmt_idx;
                                }
                                if (*pbVar5 != 0x72) break;
                                pvVar6 = mmt_load_data(0xb);
                                uVar3 = *(byte *)((long)pvVar6 + 9) + 0xb;
                                pmVar7 = (mmt_read *)mmt_load_data(uVar3);
                                mmt_check_eor(uVar3);
                                if (funcs->memread != (_func_void_mmt_read_ptr_void_ptr *)0x0) {
                                  (*funcs->memread)(pmVar7,state);
                                }
                                mmt_idx = uVar3 + mmt_idx;
                              }
                              if (*pbVar5 != 0x52) break;
                              pvVar6 = mmt_load_data(0xb);
                              uVar3 = *(byte *)((long)pvVar6 + 9) + 0xb;
                              pmVar8 = (mmt_read2 *)mmt_load_data(uVar3);
                              mmt_check_eor(uVar3);
                              if (funcs->memread2 != (_func_void_mmt_read2_ptr_void_ptr *)0x0) {
                                (*funcs->memread2)(pmVar8,state);
                              }
                              mmt_idx = uVar3 + mmt_idx;
                            }
                            if (*pbVar5 != 0x77) break;
                            pvVar6 = mmt_load_data(0xb);
                            uVar3 = *(byte *)((long)pvVar6 + 9) + 0xb;
                            pmVar9 = (mmt_write *)mmt_load_data(uVar3);
                            mmt_check_eor(uVar3);
                            if (funcs->memwrite != (_func_void_mmt_write_ptr_void_ptr *)0x0) {
                              (*funcs->memwrite)(pmVar9,state);
                            }
                            mmt_idx = uVar3 + mmt_idx;
                          }
                          if (*pbVar5 != 0x57) break;
                          pvVar6 = mmt_load_data(0xb);
                          uVar3 = *(byte *)((long)pvVar6 + 9) + 0xb;
                          pmVar10 = (mmt_write2 *)mmt_load_data(uVar3);
                          mmt_check_eor(uVar3);
                          if (funcs->memwrite2 != (_func_void_mmt_write2_ptr_void_ptr *)0x0) {
                            (*funcs->memwrite2)(pmVar10,state);
                          }
                          mmt_idx = uVar3 + mmt_idx;
                        }
                        if (*pbVar5 != 0x4d) break;
                        pmVar11 = (mmt_mmap2 *)mmt_load_data(0x2a);
                        mmt_check_eor(0x2a);
                        if (funcs->mmap2 != (_func_void_mmt_mmap2_ptr_void_ptr *)0x0) {
                          (*funcs->mmap2)(pmVar11,state);
                        }
                        mmt_idx = mmt_idx + 0x2a;
                      }
                      if (*pbVar5 != 0x6d) break;
                      pmVar12 = (mmt_mmap *)mmt_load_data(0x1e);
                      mmt_check_eor(0x1e);
                      if (funcs->mmap != (_func_void_mmt_mmap_ptr_void_ptr *)0x0) {
                        (*funcs->mmap)(pmVar12,state);
                      }
                      mmt_idx = mmt_idx + 0x1e;
                    }
                    if (*pbVar5 != 0x75) break;
                    pmVar13 = (mmt_unmap *)mmt_load_data(0x2e);
                    mmt_check_eor(0x2e);
                    if (funcs->munmap != (_func_void_mmt_unmap_ptr_void_ptr *)0x0) {
                      (*funcs->munmap)(pmVar13,state);
                    }
                    mmt_idx = mmt_idx + 0x2e;
                  }
                  if (*pbVar5 != 0x65) break;
                  pmVar14 = (mmt_mremap *)mmt_load_data(0x3e);
                  mmt_check_eor(0x3e);
                  if (funcs->mremap != (_func_void_mmt_mremap_ptr_void_ptr *)0x0) {
                    (*funcs->mremap)(pmVar14,state);
                  }
                  mmt_idx = mmt_idx + 0x3e;
                }
                if (*pbVar5 != 0x6f) break;
                pvVar6 = mmt_load_data(0x12);
                mmt_buf_check_sanity((mmt_buf *)((long)pvVar6 + 0xd));
                uVar3 = *(int *)((long)pvVar6 + 0xd) + 0x12;
                pmVar15 = (mmt_open *)mmt_load_data(uVar3);
                mmt_check_eor(uVar3);
                if (funcs->open != (_func_void_mmt_open_ptr_void_ptr *)0x0) {
                  (*funcs->open)(pmVar15,state);
                }
                mmt_idx = uVar3 + mmt_idx;
              }
              if (*pbVar5 != 0x6e) break;
              mmt_decode_nvidia((mmt_nvidia_decode_funcs *)funcs,state);
            }
            if (*pbVar5 != 0x74) break;
            pvVar6 = mmt_load_data(10);
            mmt_buf_check_sanity((mmt_buf *)((long)pvVar6 + 5));
            uVar3 = *(int *)((long)pvVar6 + 5) + 10;
            pmVar16 = (mmt_write_syscall *)mmt_load_data(uVar3);
            mmt_check_eor(uVar3);
            if (funcs->write_syscall != (_func_void_mmt_write_syscall_ptr_void_ptr *)0x0) {
              (*funcs->write_syscall)(pmVar16,state);
            }
            mmt_idx = uVar3 + mmt_idx;
          }
          if (*pbVar5 != 0x53) break;
          pmVar17 = (mmt_sync *)mmt_load_data(6);
          mmt_check_eor(6);
          if (funcs->sync != (_func_void_mmt_sync_ptr_void_ptr *)0x0) {
            (*funcs->sync)(pmVar17,state);
          }
          mmt_idx = mmt_idx + 6;
        }
        if (*pbVar5 != 100) break;
        pmVar18 = (mmt_dup_syscall *)mmt_load_data(10);
        mmt_check_eor(10);
        if (funcs->dup_syscall != (_func_void_mmt_dup_syscall_ptr_void_ptr *)0x0) {
          (*funcs->dup_syscall)(pmVar18,state);
        }
        mmt_idx = mmt_idx + 10;
      }
      if (*pbVar5 == 0x69) break;
      if (*pbVar5 != 0x6a) {
        fflush(_stdout);
        fprintf(_stderr,"unknown type: 0x%x\n",(ulong)*pbVar5);
        fprintf(_stderr,"%c\n",(ulong)*pbVar5);
        mmt_dump_next();
        exit(1);
      }
      do {
        pmStack_490 = (mmt_ioctl_post_v2 *)mmt_load_data(0x1e);
        mmt_buf_check_sanity((mmt_buf *)((long)pmStack_490 + 0x19));
        uVar3 = *(int *)((long)pmStack_490 + 0x19) + 0x1e;
        pmStack_490 = (mmt_ioctl_post_v2 *)mmt_load_data(uVar3);
        mmt_check_eor(uVar3);
        d_1._4_4_ = 0;
        local_2a0 = uVar3;
        do {
          uVar4 = load_memory_dump_v2(local_2a0,(mmt_memory_dump_v2_prefix **)&b_1,&local_4a8);
          pmVar1 = pmStack_490;
          if (uVar4 == 0) break;
          args_1[(long)d_1._4_4_ + -1].data = *(mmt_buf **)((long)&b_1->len + 1);
          args_1[d_1._4_4_].str = local_4a8;
          args_1[d_1._4_4_].addr = 0;
          d_1._4_4_ = d_1._4_4_ + 1;
          local_2a0 = uVar4 + local_2a0;
        } while (d_1._4_4_ != 0x14);
        pmVar20 = (mmt_ioctl_post_v2 *)mmt_load_data(uVar3);
      } while (pmVar1 != pmVar20);
      if (funcs->ioctl_post !=
          (_func_void_mmt_ioctl_post_v2_ptr_void_ptr_mmt_memory_dump_ptr_int *)0x0) {
        (*funcs->ioctl_post)(pmStack_490,state,(mmt_memory_dump *)&ctl_1,d_1._4_4_);
      }
      mmt_idx = local_2a0 + mmt_idx;
    }
    do {
      pmStack_280 = (mmt_ioctl_pre_v2 *)mmt_load_data(0xe);
      mmt_buf_check_sanity((mmt_buf *)((long)pmStack_280 + 9));
      uVar3 = *(int *)((long)pmStack_280 + 9) + 0xe;
      pmStack_280 = (mmt_ioctl_pre_v2 *)mmt_load_data(uVar3);
      mmt_check_eor(uVar3);
      d._4_4_ = 0;
      args[0x13].data._0_4_ = uVar3;
      do {
        args[0x13].data._4_4_ =
             load_memory_dump_v2((uint)args[0x13].data,(mmt_memory_dump_v2_prefix **)&b,
                                 (mmt_buf **)&pfx_1);
        pmVar2 = pmStack_280;
        if (args[0x13].data._4_4_ == 0) break;
        args[(long)d._4_4_ + -1].data = *(mmt_buf **)((long)&b->len + 1);
        args[d._4_4_].str = _pfx_1;
        args[d._4_4_].addr = 0;
        d._4_4_ = d._4_4_ + 1;
        args[0x13].data._0_4_ = args[0x13].data._4_4_ + (uint)args[0x13].data;
      } while (d._4_4_ != 0x14);
      pmVar19 = (mmt_ioctl_pre_v2 *)mmt_load_data(uVar3);
    } while (pmVar2 != pmVar19);
    if (funcs->ioctl_pre != (_func_void_mmt_ioctl_pre_v2_ptr_void_ptr_mmt_memory_dump_ptr_int *)0x0)
    {
      (*funcs->ioctl_pre)(pmStack_280,state,(mmt_memory_dump *)&ctl,d._4_4_);
    }
    mmt_idx = (uint)args[0x13].data + mmt_idx;
  } while( true );
}

Assistant:

void mmt_decode(const struct mmt_decode_funcs *funcs, void *state)
{
	unsigned int size;
	while (1)
	{
		struct mmt_message *msg = mmt_load_initial_data();
		if (msg == NULL)
			return;

		if (msg->type == '=' || msg->type == '-')
		{
			unsigned int len = 0;
			while (mmt_buf[mmt_idx + len] != 10)
				if (mmt_load_data(++len) == NULL)
					return;

			if (funcs->msg)
				funcs->msg(&mmt_buf[mmt_idx], len, state);

			mmt_idx += len + 1;
		}
		else if (msg->type == 'r') // read
		{
			struct mmt_read *w;
			size = sizeof(struct mmt_read) + 1;
			w = mmt_load_data(size);
			size += w->len;
			w = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->memread)
				funcs->memread(w, state);

			mmt_idx += size;
		}
		else if (msg->type == 'R') // read2
		{
			struct mmt_read2 *w;
			size = sizeof(struct mmt_read2) + 1;
			w = mmt_load_data(size);
			size += w->len;
			w = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->memread2)
				funcs->memread2(w, state);

			mmt_idx += size;
		}
		else if (msg->type == 'w') // write
		{
			struct mmt_write *w;
			size = sizeof(struct mmt_write) + 1;
			w = mmt_load_data(size);
			size += w->len;
			w = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->memwrite)
				funcs->memwrite(w, state);

			mmt_idx += size;
		}
		else if (msg->type == 'W') // write2
		{
			struct mmt_write2 *w;
			size = sizeof(struct mmt_write2) + 1;
			w = mmt_load_data(size);
			size += w->len;
			w = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->memwrite2)
				funcs->memwrite2(w, state);

			mmt_idx += size;
		}
		else if (msg->type == 'M') // mmap v2
		{
			size = sizeof(struct mmt_mmap2) + 1;
			struct mmt_mmap2 *mm = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->mmap2)
				funcs->mmap2(mm, state);

			mmt_idx += size;
		}
		else if (msg->type == 'm') // mmap
		{
			size = sizeof(struct mmt_mmap) + 1;
			struct mmt_mmap *mm = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->mmap)
				funcs->mmap(mm, state);

			mmt_idx += size;
		}
		else if (msg->type == 'u') // unmap
		{
			size = sizeof(struct mmt_unmap) + 1;
			struct mmt_unmap *mm = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->munmap)
				funcs->munmap(mm, state);

			mmt_idx += size;
		}
		else if (msg->type == 'e') // mremap
		{
			size = sizeof(struct mmt_mremap) + 1;
			struct mmt_mremap *mm = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->mremap)
				funcs->mremap(mm, state);

			mmt_idx += size;
		}
		else if (msg->type == 'o') // open
		{
			size = sizeof(struct mmt_open) + 1;
			struct mmt_open *o;
			o = mmt_load_data(size);
			mmt_buf_check_sanity(&o->path);
			size += o->path.len;
			o = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->open)
				funcs->open(o, state);

			mmt_idx += size;
		}
		else if (msg->type == 'n') // nvidia / nouveau
			mmt_decode_nvidia((struct mmt_nvidia_decode_funcs *)funcs, state);
		else if (msg->type == 't') // write syscall
		{
			struct mmt_write_syscall *w;
			size = sizeof(struct mmt_write_syscall) + 1;
			w = mmt_load_data(size);
			mmt_buf_check_sanity(&w->data);
			size += w->data.len;
			w = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->write_syscall)
				funcs->write_syscall(w, state);

			mmt_idx += size;
		}
		else if (msg->type == 'S') // sync
		{
			size = sizeof(struct mmt_sync) + 1;
			struct mmt_sync *mm = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->sync)
				funcs->sync(mm, state);

			mmt_idx += size;
		}
		else if (msg->type == 'd') // dup syscall
		{
			size = sizeof(struct mmt_dup_syscall) + 1;
			struct mmt_dup_syscall *mm = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->dup_syscall)
				funcs->dup_syscall(mm, state);

			mmt_idx += size;
		}
		else if (msg->type == 'i') // ioctl pre
		{
#define MAX_ARGS 20
			unsigned int size2, pfx;
			struct mmt_memory_dump args[MAX_ARGS];
			struct mmt_ioctl_pre_v2 *ctl;
			int argc;

			do
			{
				size = sizeof(struct mmt_ioctl_pre_v2) + 1;
				ctl = mmt_load_data(size);
				mmt_buf_check_sanity(&ctl->data);
				size += ctl->data.len;
				ctl = mmt_load_data(size);

				mmt_check_eor(size);

				argc = 0;

				struct mmt_memory_dump_v2_prefix *d;
				struct mmt_buf *b;
				pfx = size;

				while ((size2 = load_memory_dump_v2(pfx, &d, &b)))
				{
					args[argc].addr = d->addr;
					args[argc].data = b;
					args[argc].str = NULL;
					argc++;
					pfx += size2;
					if (argc == MAX_ARGS)
						break;
				}
			}
			while (ctl != mmt_load_data(size));

			if (funcs->ioctl_pre)
				funcs->ioctl_pre(ctl, state, args, argc);

			mmt_idx += pfx;
		}
		else if (msg->type == 'j')
		{
			unsigned int size2, pfx;
			struct mmt_memory_dump args[MAX_ARGS];
			struct mmt_ioctl_post_v2 *ctl;
			int argc;

			do
			{
				size = sizeof(struct mmt_ioctl_post_v2) + 1;
				ctl = mmt_load_data(size);
				mmt_buf_check_sanity(&ctl->data);
				size += ctl->data.len;
				ctl = mmt_load_data(size);

				mmt_check_eor(size);

				argc = 0;

				struct mmt_memory_dump_v2_prefix *d;
				struct mmt_buf *b;
				pfx = size;

				while ((size2 = load_memory_dump_v2(pfx, &d, &b)))
				{
					args[argc].addr = d->addr;
					args[argc].data = b;
					args[argc].str = NULL;
					argc++;
					pfx += size2;
					if (argc == MAX_ARGS)
						break;
				}
			}
			while (ctl != mmt_load_data(size));

			if (funcs->ioctl_post)
				funcs->ioctl_post(ctl, state, args, argc);

			mmt_idx += pfx;
#undef MAX_ARGS
		}
		else
		{
			fflush(stdout);
			fprintf(stderr, "unknown type: 0x%x\n", msg->type);
			fprintf(stderr, "%c\n", msg->type);
			mmt_dump_next();
			exit(1);
		}
	}
}